

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  IfcConstructionResource *this_00;
  char *pcVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcConstructionResource + -0x18);
  this_00 = (IfcConstructionResource *)(&(this->super_IfcConstructionResource).field_0x0 + lVar2);
  pcVar1 = (this->JobDescription).ptr.field_2._M_local_buf + lVar2;
  pcVar1[-0x1b0] = -0x80;
  pcVar1[-0x1af] = '5';
  pcVar1[-0x1ae] = -0x70;
  pcVar1[-0x1ad] = '\0';
  pcVar1[-0x1ac] = '\0';
  pcVar1[-0x1ab] = '\0';
  pcVar1[-0x1aa] = '\0';
  pcVar1[-0x1a9] = '\0';
  pcVar1[0x18] = 'p';
  pcVar1[0x19] = '6';
  pcVar1[0x1a] = -0x70;
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[-0x128] = -0x58;
  pcVar1[-0x127] = '5';
  pcVar1[-0x126] = -0x70;
  pcVar1[-0x125] = '\0';
  pcVar1[-0x124] = '\0';
  pcVar1[-0x123] = '\0';
  pcVar1[-0x122] = '\0';
  pcVar1[-0x121] = '\0';
  pcVar1[-0x118] = -0x30;
  pcVar1[-0x117] = '5';
  pcVar1[-0x116] = -0x70;
  pcVar1[-0x115] = '\0';
  pcVar1[-0x114] = '\0';
  pcVar1[-0x113] = '\0';
  pcVar1[-0x112] = '\0';
  pcVar1[-0x111] = '\0';
  pcVar1[-0xe0] = -8;
  pcVar1[-0xdf] = '5';
  pcVar1[-0xde] = -0x70;
  pcVar1[-0xdd] = '\0';
  pcVar1[-0xdc] = '\0';
  pcVar1[-0xdb] = '\0';
  pcVar1[-0xda] = '\0';
  pcVar1[-0xd9] = '\0';
  pcVar1[-0xd0] = ' ';
  pcVar1[-0xcf] = '6';
  pcVar1[-0xce] = -0x70;
  pcVar1[-0xcd] = '\0';
  pcVar1[-0xcc] = '\0';
  pcVar1[-0xcb] = '\0';
  pcVar1[-0xca] = '\0';
  pcVar1[-0xc9] = '\0';
  pcVar1[-0x38] = 'H';
  pcVar1[-0x37] = '6';
  pcVar1[-0x36] = -0x70;
  pcVar1[-0x35] = '\0';
  pcVar1[-0x34] = '\0';
  pcVar1[-0x33] = '\0';
  pcVar1[-0x32] = '\0';
  pcVar1[-0x31] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_00 + 1) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_00 + 1));
  }
  IfcConstructionResource::~IfcConstructionResource(this_00,&PTR_construction_vtable_24__00903688);
  operator_delete(this_00);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}